

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepper.h
# Opt level: O3

void __thiscall
chrono::ChTimestepperEulerExplIIorder::~ChTimestepperEulerExplIIorder
          (ChTimestepperEulerExplIIorder *this)

{
  double *pdVar1;
  
  (this->super_ChTimestepperIIorder).super_ChTimestepper._vptr_ChTimestepper =
       (_func_int **)&PTR__ChTimestepperEulerExplIIorder_00b43198;
  pdVar1 = (this->Dv).super_ChVectorDynamic<double>.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (pdVar1 != (double *)0x0) {
    free((void *)pdVar1[-1]);
  }
  ChTimestepperIIorder::~ChTimestepperIIorder(&this->super_ChTimestepperIIorder);
  operator_delete(this,0x98);
  return;
}

Assistant:

class ChApi ChTimestepperEulerExplIIorder : public ChTimestepperIIorder {
  protected:
    ChStateDelta Dv;

  public:
    /// Constructors (default empty)
    ChTimestepperEulerExplIIorder(ChIntegrableIIorder* intgr = nullptr) : ChTimestepperIIorder(intgr) {}

    virtual Type GetType() const override { return Type::EULER_EXPLICIT; }

    /// Performs an integration timestep
    virtual void Advance(const double dt  ///< timestep to advance
                         ) override;
}